

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

void __thiscall
spvtools::disassemble::InstructionDisassembler::SetRed
          (InstructionDisassembler *this,ostream *stream)

{
  char *pcVar1;
  red local_19;
  ostream *local_18;
  ostream *stream_local;
  InstructionDisassembler *this_local;
  
  if ((this->color_ & 1U) != 0) {
    local_19.isPrint = (bool)(this->print_ & 1);
    local_18 = stream;
    stream_local = (ostream *)this;
    pcVar1 = clr::red::operator_cast_to_char_(&local_19);
    std::operator<<(stream,pcVar1);
  }
  return;
}

Assistant:

void InstructionDisassembler::SetRed(std::ostream& stream) const {
  if (color_) stream << spvtools::clr::red{print_};
}